

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# peer_connection.cpp
# Opt level: O1

void __thiscall libtorrent::peer_connection::send_upload_only(peer_connection *this,bool enabled)

{
  int iVar1;
  undefined4 extraout_var;
  
  if (((this->super_peer_connection_hot_members).field_0x28 & 2) == 0) {
    iVar1 = (*(this->super_bandwidth_socket)._vptr_bandwidth_socket[0x1b])();
    if ((char)iVar1 == '\0') {
      iVar1 = (*(((this->super_peer_connection_hot_members).m_ses)->super_session_logger).
                _vptr_session_logger[5])();
      if ((short)*(undefined4 *)(CONCAT44(extraout_var,iVar1) + 0x68) < 0) {
        peer_log(this,outgoing_message,"UPLOAD_ONLY","%d",enabled);
      }
      (*(this->super_bandwidth_socket)._vptr_bandwidth_socket[0x2d])(this,enabled);
      return;
    }
  }
  return;
}

Assistant:

void peer_connection::send_upload_only(bool const enabled)
	{
		TORRENT_ASSERT(is_single_thread());
		if (m_connecting || in_handshake()) return;

#ifndef TORRENT_DISABLE_LOGGING
		if (should_log(peer_log_alert::outgoing_message))
		{
			peer_log(peer_log_alert::outgoing_message, "UPLOAD_ONLY", "%d"
				, int(enabled));
		}
#endif

		write_upload_only(enabled);
	}